

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::select_base::element::element(element *this,string *v,string *msg)

{
  string *in_RDX;
  string *in_RSI;
  uint *in_RDI;
  basic_message<char> *this_00;
  
  *in_RDI = *in_RDI & 0xfffffffe;
  this_00 = (basic_message<char> *)(in_RDI + 2);
  std::__cxx11::string::string((string *)this_00,in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 10),in_RDX);
  booster::locale::basic_message<char>::basic_message(this_00);
  booster::copy_ptr<cppcms::widgets::select_base::element::_data>::copy_ptr
            ((copy_ptr<cppcms::widgets::select_base::element::_data> *)(in_RDI + 0x32));
  return;
}

Assistant:

select_base::element::element(std::string const &v,std::string const &msg) :
	need_translation(0),
	id(v),
	str_option(msg)
{
}